

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O3

void __thiscall FEventTree::PrintTree(FEventTree *this,FEvent *event)

{
  char buff [100];
  char acStack_88 [112];
  
  if ((FEventTree *)event != this) {
    PrintTree(this,event->Left);
    c_sqrt(event->Distance * 2.3283064365386963e-10);
    sprintf(acStack_88," Distance %g, vertex %d, seg %u\n",(ulong)(uint)(event->Info).Vertex,
            (ulong)(event->Info).FrontSeg);
    Printf(5,"%s",acStack_88);
    PrintTree(this,event->Right);
  }
  return;
}

Assistant:

void FEventTree::PrintTree (const FEvent *event) const
{
	// Use the CRT's sprintf so that it shares the same formatting as ZDBSP's output.
	char buff[100];
	if (event != &Nil)
	{
		PrintTree(event->Left);
		sprintf(buff, " Distance %g, vertex %d, seg %u\n",
			g_sqrt(event->Distance/4294967296.0), event->Info.Vertex, (unsigned)event->Info.FrontSeg);
		Printf(PRINT_LOG, "%s", buff);
		PrintTree(event->Right);
	}
}